

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O2

QPDFObjectHandle __thiscall QPDF::JSONReactor::makeObject(JSONReactor *this,JSON *value)

{
  double num;
  string *psVar1;
  bool bVar2;
  long lVar3;
  qpdf_offset_t offset;
  logic_error *this_00;
  undefined1 trim_trailing_zeroes;
  JSON *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar4;
  undefined1 in_stack_ffffffffffffff2f;
  bool bool_v;
  allocator<char> local_c9;
  string str;
  string local_a8;
  string str_v;
  int gen;
  int obj;
  string local_58;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  str_v._M_dataplus._M_p = (pointer)&str_v.field_2;
  str_v._M_string_length = 0;
  (this->super_Reactor)._vptr_Reactor = (_func_int **)0x0;
  this->pdf = (QPDF *)0x0;
  trim_trailing_zeroes = 0;
  str_v.field_2._M_local_buf[0] = '\0';
  bool_v = false;
  bVar2 = JSON::isDictionary(in_RDX);
  if (bVar2) {
    QPDFObjectHandle::newDictionary();
  }
  else {
    bVar2 = JSON::isArray(in_RDX);
    if (!bVar2) {
      bVar2 = JSON::isNull(in_RDX);
      if (bVar2) {
        QPDFObjectHandle::newNull();
      }
      else {
        bVar2 = JSON::getBool(in_RDX,&bool_v);
        if (bVar2) {
          QPDFObjectHandle::newBool((bool)in_stack_ffffffffffffff2f);
        }
        else {
          bVar2 = JSON::getNumber(in_RDX,&str_v);
          if (!bVar2) {
            bVar2 = JSON::getString(in_RDX,&str_v);
            if (!bVar2) goto LAB_001d237b;
            obj = 0;
            gen = 0;
            str._M_dataplus._M_p = (pointer)&str.field_2;
            str._M_string_length = 0;
            str.field_2._M_local_buf[0] = '\0';
            bVar2 = is_indirect_object(&str_v,&obj,&gen);
            if (bVar2) {
              getObjectForJSON((QPDF *)&local_58,
                               (int)(value->m).
                                    super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi,obj);
              psVar1 = &local_58;
              local_a8._M_dataplus._M_p = local_58._M_dataplus._M_p;
              local_a8._M_string_length = local_58._M_string_length;
              local_58._M_dataplus._M_p = (pointer)0x0;
              local_58._M_string_length = 0;
              std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
                         (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_a8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
LAB_001d2541:
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&psVar1->_M_string_length);
            }
            else {
              bVar2 = is_unicode_string(&str_v,&str);
              if (bVar2) {
                QPDFObjectHandle::newUnicodeString((QPDFObjectHandle *)&local_a8,&str);
LAB_001d252f:
                std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
                           (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_a8);
                psVar1 = &local_a8;
                goto LAB_001d2541;
              }
              bVar2 = is_binary_string(&str_v,&str);
              if (!bVar2) {
                bVar2 = is_name(&str_v);
                if (bVar2) {
                  QPDFObjectHandle::newName(&local_a8);
                }
                else {
                  bVar2 = is_pdf_name(&str_v);
                  if (bVar2) {
                    std::__cxx11::string::substr((ulong)&local_a8,(ulong)&str_v);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_58,"",&local_c9);
                    QPDFObjectHandle::parse((QPDFObjectHandle *)&local_38,&local_a8,&local_58);
                    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
                               &local_38);
                    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                              (&local_38._M_refcount);
                    std::__cxx11::string::~string((string *)&local_58);
                    goto LAB_001d25a6;
                  }
                  offset = JSON::getStart(in_RDX);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_a8,"unrecognized string value",
                             (allocator<char> *)&local_58);
                  error((JSONReactor *)value,offset,&local_a8);
                  std::__cxx11::string::~string((string *)&local_a8);
                  QPDFObjectHandle::newNull();
                }
                goto LAB_001d252f;
              }
              QUtil::hex_decode(&local_a8,&str);
              QPDFObjectHandle::newString(&local_58);
              std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                        ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
                         (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_58);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
LAB_001d25a6:
              std::__cxx11::string::~string((string *)&local_a8);
            }
            std::__cxx11::string::~string((string *)&str);
            goto LAB_001d237b;
          }
          bVar2 = QUtil::is_long_long(str_v._M_dataplus._M_p);
          if (bVar2) {
            QUtil::string_to_ll(str_v._M_dataplus._M_p);
            QPDFObjectHandle::newInteger((longlong)str._M_dataplus._M_p);
            goto LAB_001d2364;
          }
          lVar3 = std::__cxx11::string::find((char)&str_v,0x65);
          if (lVar3 == -1) {
            lVar3 = std::__cxx11::string::find((char)&str_v,0x45);
            if (lVar3 != -1) goto LAB_001d24c4;
          }
          else {
LAB_001d24c4:
            num = std::__cxx11::stod(&str_v,(size_t *)0x0);
            QUtil::double_to_string_abi_cxx11_(&str,(QUtil *)0x0,num,1,(bool)trim_trailing_zeroes);
            std::__cxx11::string::operator=((string *)&str_v,(string *)&str);
            std::__cxx11::string::~string((string *)&str);
          }
          QPDFObjectHandle::newReal(&str);
        }
      }
LAB_001d2364:
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&str);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&str._M_string_length);
      goto LAB_001d237b;
    }
    QPDFObjectHandle::newArray();
  }
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&str);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&str._M_string_length);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(value + 8),
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)this);
  *(undefined4 *)&value[9].m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       7;
LAB_001d237b:
  if ((this->super_Reactor)._vptr_Reactor != (_func_int **)0x0) {
    bVar2 = QPDFObjectHandle::hasObjectDescription((QPDFObjectHandle *)this);
    if (!bVar2) {
      setObjectDescription((JSONReactor *)value,(QPDFObjectHandle *)this,in_RDX);
    }
    std::__cxx11::string::~string((string *)&str_v);
    QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (QPDFObjectHandle)
           QVar4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"JSONReactor::makeObject didn\'t initialize the object");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

QPDFObjectHandle
QPDF::JSONReactor::makeObject(JSON const& value)
{
    QPDFObjectHandle result;
    std::string str_v;
    bool bool_v = false;
    if (value.isDictionary()) {
        result = QPDFObjectHandle::newDictionary();
        next_obj = result;
        next_state = st_object;
    } else if (value.isArray()) {
        result = QPDFObjectHandle::newArray();
        next_obj = result;
        next_state = st_object;
    } else if (value.isNull()) {
        result = QPDFObjectHandle::newNull();
    } else if (value.getBool(bool_v)) {
        result = QPDFObjectHandle::newBool(bool_v);
    } else if (value.getNumber(str_v)) {
        if (QUtil::is_long_long(str_v.c_str())) {
            result = QPDFObjectHandle::newInteger(QUtil::string_to_ll(str_v.c_str()));
        } else {
            // JSON allows scientific notation, but PDF does not.
            if (str_v.find('e') != std::string::npos || str_v.find('E') != std::string::npos) {
                try {
                    auto v = std::stod(str_v);
                    str_v = QUtil::double_to_string(v);
                } catch (std::exception&) {
                    // Keep it as it was
                }
            }
            result = QPDFObjectHandle::newReal(str_v);
        }
    } else if (value.getString(str_v)) {
        int obj = 0;
        int gen = 0;
        std::string str;
        if (is_indirect_object(str_v, obj, gen)) {
            result = pdf.getObjectForJSON(obj, gen);
        } else if (is_unicode_string(str_v, str)) {
            result = QPDFObjectHandle::newUnicodeString(str);
        } else if (is_binary_string(str_v, str)) {
            result = QPDFObjectHandle::newString(QUtil::hex_decode(str));
        } else if (is_name(str_v)) {
            result = QPDFObjectHandle::newName(str_v);
        } else if (is_pdf_name(str_v)) {
            result = QPDFObjectHandle::parse(str_v.substr(2));
        } else {
            QTC::TC("qpdf", "QPDF_json unrecognized string value");
            error(value.getStart(), "unrecognized string value");
            result = QPDFObjectHandle::newNull();
        }
    }
    if (!result) {
        throw std::logic_error("JSONReactor::makeObject didn't initialize the object");
    }

    if (!result.hasObjectDescription()) {
        setObjectDescription(result, value);
    }
    return result;
}